

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O2

ByteData * cfd::core::CryptoUtil::DecodeBase58Check(ByteData *__return_storage_ptr__,string *str)

{
  CfdException *this;
  allocator local_65;
  int ret;
  size_t written;
  vector<unsigned_char,_std::allocator<unsigned_char>_> output;
  string local_40;
  
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&output,0x400,
             (allocator_type *)&local_40);
  written = 0;
  ret = wally_base58_to_bytes
                  ((str->_M_dataplus)._M_p,1,
                   output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (long)output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start,&written);
  if (ret == 0) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&output,written);
    ByteData::ByteData(__return_storage_ptr__,&output);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    return __return_storage_ptr__;
  }
  local_40._M_dataplus._M_p = "cfdcore_util.cpp";
  local_40._M_string_length._0_4_ = 0x3f2;
  local_40.field_2._M_allocated_capacity = (long)"CfdEncodeDecodeBase58Check" + 9;
  logger::warn<int&>((CfdSourceLocation *)&local_40,"wally_base58_to_bytes NG[{}].",&ret);
  this = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)&local_40,"Decode base58 error.",&local_65);
  CfdException::CfdException(this,kCfdIllegalStateError,&local_40);
  __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ByteData CryptoUtil::DecodeBase58Check(const std::string &str) {
  std::vector<uint8_t> output(1024);
  size_t written = 0;

  int ret = wally_base58_to_bytes(
      str.data(), BASE58_FLAG_CHECKSUM, output.data(), output.size(),
      &written);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_base58_to_bytes NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "Decode base58 error.");
  }

  output.resize(written);
  return ByteData(output);
}